

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.hpp
# Opt level: O2

ExecValueAccess __thiscall rsg::Expression::getLValue(Expression *this)

{
  Exception *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Expression::getLValue(): not L-value node",&local_39);
  Exception::Exception(this_00,&local_38);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual ExecValueAccess			getLValue			(void) const { DE_ASSERT(DE_FALSE); throw Exception("Expression::getLValue(): not L-value node"); }